

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseFaceChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  pointer pMVar1;
  pointer pFVar2;
  pointer pMVar3;
  char *__s2;
  pointer puVar4;
  char *__s1;
  char cVar5;
  ushort uVar6;
  uint32_t uVar7;
  int iVar8;
  Logger *pLVar9;
  runtime_error *this_01;
  uint uVar10;
  uint uVar11;
  pointer pMVar12;
  uint32_t *puVar13;
  int iVar14;
  ulong uVar15;
  Chunk chunk;
  char *sz;
  Chunk local_1da;
  uint local_1d4;
  char *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [96];
  ios_base local_138 [264];
  
  uVar10 = *(int *)&this->stream->limit - *(int *)&this->stream->current;
  do {
    while( true ) {
      if (uVar10 < 6) {
        return;
      }
      ReadChunk(this,&local_1da);
      uVar10 = local_1da.Size - 6;
      if (0 < (int)uVar10) break;
      uVar10 = (int)this->stream->limit - (int)this->stream->current;
    }
    this_00 = this->stream;
    local_1d4 = StreamReader<false,_false>::SetReadLimit
                          (this_00,(*(int *)&this_00->current - *(int *)&this_00->buffer) + uVar10);
    pMVar1 = (this->mScene->mMeshes).
             super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_1da.Flag == 0x4130) {
      local_1d0 = this->stream->current;
      do {
        cVar5 = StreamReader<false,_false>::Get<signed_char>(this->stream);
        __s1 = local_1d0;
      } while (cVar5 != '\0');
      pMVar12 = (this->mScene->mMaterials).
                super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pMVar3 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pMVar12 != pMVar3) {
        iVar14 = 0;
        do {
          if ((pMVar12->mName)._M_string_length != 0) {
            if (__s1 == (char *)0x0) {
              __assert_fail("__null != s1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                            ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
            }
            __s2 = (pMVar12->mName)._M_dataplus._M_p;
            if (__s2 == (char *)0x0) {
              __assert_fail("__null != s2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                            ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
            }
            iVar8 = strcasecmp(__s1,__s2);
            if (iVar8 == 0) {
              if (iVar14 != 0x32323233) {
                uVar10 = -iVar14;
                goto LAB_003ecf8a;
              }
              break;
            }
          }
          pMVar12 = pMVar12 + 1;
          iVar14 = iVar14 + -1;
        } while (pMVar12 != pMVar3);
      }
      pLVar9 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[24]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [24])"3DS: Unknown material: ");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                 &local_1d0);
      std::__cxx11::stringbuf::str();
      Logger::error(pLVar9,(char *)local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar10 = 0xcdcdcdcd;
LAB_003ecf8a:
      uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
      if (uVar6 != 0) {
        uVar11 = (uint)uVar6;
        do {
          uVar6 = StreamReader<false,_false>::Get<short>(this->stream);
          puVar4 = pMVar1[-1].mFaceMaterials.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)uVar6 <
              (ulong)((long)pMVar1[-1].mFaceMaterials.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar4 >> 2)) {
            puVar4[uVar6] = uVar10;
          }
          else {
            pLVar9 = DefaultLogger::get();
            Logger::error(pLVar9,"3DS: Invalid face index in face material list");
          }
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
    }
    else if (local_1da.Flag == 0x4150) {
      uVar15 = (ulong)(uVar10 >> 2);
      pFVar2 = pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
               super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)pMVar1[-1].super_MeshWithSmoothingGroups<Assimp::D3DS::Face>.mFaces.
                        super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 4) < uVar15) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1a8[0] = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"3DS: More smoothing groups than faces","");
        std::runtime_error::runtime_error(this_01,(string *)local_1a8);
        *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (3 < uVar10) {
        puVar13 = &(pFVar2->super_FaceWithSmoothingGroup).iSmoothGroup;
        do {
          uVar7 = StreamReader<false,_false>::Get<int>(this->stream);
          *puVar13 = uVar7;
          puVar13 = puVar13 + 4;
          uVar10 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar10;
        } while (uVar10 != 0);
      }
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,local_1d4);
    uVar10 = (int)this->stream->limit - (int)this->stream->current;
    if (uVar10 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseFaceChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // Get the mesh we're currently working on
    D3DS::Mesh& mMesh = mScene->mMeshes.back();

    // Get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_SMOOLIST:
        {
        // This is the list of smoothing groups - a bitfield for every face.
        // Up to 32 smoothing groups assigned to a single face.
        unsigned int num = chunkSize/4, m = 0;
        if (num > mMesh.mFaces.size())  {
            throw DeadlyImportError("3DS: More smoothing groups than faces");
        }
        for (std::vector<D3DS::Face>::iterator i =  mMesh.mFaces.begin(); m != num;++i, ++m)    {
            // nth bit is set for nth smoothing group
            (*i).iSmoothGroup = stream->GetI4();
        }}
        break;

    case Discreet3DS::CHUNK_FACEMAT:
        {
        // at fist an asciiz with the material name
        const char* sz = (const char*)stream->GetPtr();
        while (stream->GetI1());

        // find the index of the material
        unsigned int idx = 0xcdcdcdcd, cnt = 0;
        for (std::vector<D3DS::Material>::const_iterator i =  mScene->mMaterials.begin();i != mScene->mMaterials.end();++i,++cnt)   {
            // use case independent comparisons. hopefully it will work.
            if ((*i).mName.length() && !ASSIMP_stricmp(sz, (*i).mName.c_str())) {
                idx = cnt;
                break;
            }
        }
        if (0xcdcdcdcd == idx)  {
            ASSIMP_LOG_ERROR_F( "3DS: Unknown material: ", sz);
        }

        // Now continue and read all material indices
        cnt = (uint16_t)stream->GetI2();
        for (unsigned int i = 0; i < cnt;++i)   {
            unsigned int fidx = (uint16_t)stream->GetI2();

            // check range
            if (fidx >= mMesh.mFaceMaterials.size())    {
                ASSIMP_LOG_ERROR("3DS: Invalid face index in face material list");
            }
            else mMesh.mFaceMaterials[fidx] = idx;
        }}
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}